

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddNotNull(Parse *pParse,int onError)

{
  Table *pTVar1;
  Column *pCVar2;
  int iVar3;
  Index *local_30;
  Index *pIdx;
  Column *pCol;
  Table *p;
  int onError_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  if ((pTVar1 != (Table *)0x0) && (0 < pTVar1->nCol)) {
    pCVar2 = pTVar1->aCol;
    iVar3 = pTVar1->nCol + -1;
    pCVar2[iVar3].notNull = (u8)onError;
    pTVar1->tabFlags = pTVar1->tabFlags | 0x200;
    if ((pCVar2[iVar3].colFlags & 8) != 0) {
      for (local_30 = pTVar1->pIndex; local_30 != (Index *)0x0; local_30 = local_30->pNext) {
        if ((int)*local_30->aiColumn == pTVar1->nCol + -1) {
          *(ushort *)&local_30->field_0x63 = *(ushort *)&local_30->field_0x63 & 0xfff7 | 8;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddNotNull(Parse *pParse, int onError){
  Table *p;
  Column *pCol;
  p = pParse->pNewTable;
  if( p==0 || NEVER(p->nCol<1) ) return;
  pCol = &p->aCol[p->nCol-1];
  pCol->notNull = (u8)onError;
  p->tabFlags |= TF_HasNotNull;

  /* Set the uniqNotNull flag on any UNIQUE or PK indexes already created
  ** on this column.  */
  if( pCol->colFlags & COLFLAG_UNIQUE ){
    Index *pIdx;
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nKeyCol==1 && pIdx->onError!=OE_None );
      if( pIdx->aiColumn[0]==p->nCol-1 ){
        pIdx->uniqNotNull = 1;
      }
    }
  }
}